

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O1

void __thiscall
Imath_2_5::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  Plane3<float> frustumPlanes [6];
  Plane3<float> local_78;
  float afStack_68 [20];
  
  Frustum<float>::planes(frustum,&local_78,cameraMat);
  lVar8 = 0;
  do {
    fVar1 = (&local_78.normal.x)[lVar8];
    fVar2 = afStack_68[lVar8];
    fVar16 = afStack_68[lVar8 + 4];
    *(float *)((long)&this->planeNormX[0].x + lVar8) = fVar1;
    *(float *)((long)&this->planeNormX[0].y + lVar8) = fVar2;
    *(float *)((long)&this->planeNormX[0].z + lVar8) = fVar16;
    fVar3 = afStack_68[lVar8 + -3];
    fVar4 = afStack_68[lVar8 + 1];
    fVar12 = afStack_68[lVar8 + 5];
    *(float *)((long)&this->planeNormY[0].x + lVar8) = fVar3;
    *(float *)((long)&this->planeNormY[0].y + lVar8) = fVar4;
    *(float *)((long)&this->planeNormY[0].z + lVar8) = fVar12;
    fVar5 = afStack_68[lVar8 + -2];
    fVar6 = afStack_68[lVar8 + 2];
    fVar10 = afStack_68[lVar8 + 6];
    *(float *)((long)&this->planeNormZ[0].x + lVar8) = fVar5;
    *(float *)((long)&this->planeNormZ[0].y + lVar8) = fVar6;
    *(float *)((long)&this->planeNormZ[0].z + lVar8) = fVar10;
    if (fVar16 <= -fVar16) {
      fVar16 = -fVar16;
    }
    auVar13._4_4_ = fVar2;
    auVar13._0_4_ = fVar1;
    auVar13._8_8_ = 0;
    auVar14._8_4_ = 0x80000000;
    auVar14._0_8_ = CONCAT44(fVar2,fVar1) ^ 0x8000000080000000;
    auVar14._12_4_ = 0x80000000;
    auVar14 = maxps(auVar13,auVar14);
    *(long *)((long)&this->planeNormAbsX[0].x + lVar8) = auVar14._0_8_;
    *(float *)((long)&this->planeNormAbsX[0].z + lVar8) = fVar16;
    if (fVar12 <= -fVar12) {
      fVar12 = -fVar12;
    }
    auVar11._4_4_ = fVar4;
    auVar11._0_4_ = fVar3;
    auVar11._8_8_ = 0;
    auVar15._0_8_ = CONCAT44(fVar4,fVar3) ^ 0x8000000080000000;
    auVar15._8_4_ = 0x80000000;
    auVar15._12_4_ = 0x80000000;
    auVar14 = maxps(auVar11,auVar15);
    *(long *)((long)&this->planeNormAbsY[0].x + lVar8) = auVar14._0_8_;
    *(float *)((long)&this->planeNormAbsY[0].z + lVar8) = fVar12;
    if (fVar10 <= -fVar10) {
      fVar10 = -fVar10;
    }
    auVar9._4_4_ = fVar6;
    auVar9._0_4_ = fVar5;
    auVar9._8_8_ = 0;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = CONCAT44(fVar6,fVar5) ^ 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar14 = maxps(auVar9,auVar7);
    *(long *)((long)&this->planeNormAbsZ[0].x + lVar8) = auVar14._0_8_;
    *(float *)((long)&this->planeNormAbsZ[0].z + lVar8) = fVar10;
    fVar1 = afStack_68[lVar8 + 3];
    fVar2 = afStack_68[lVar8 + 7];
    *(float *)((long)&this->planeOffsetVec[0].x + lVar8) = afStack_68[lVar8 + -1];
    *(float *)((long)&this->planeOffsetVec[0].y + lVar8) = fVar1;
    *(float *)((long)&this->planeOffsetVec[0].z + lVar8) = fVar2;
    lVar8 = lVar8 + 0xc;
  } while (lVar8 == 0xc);
  fVar1 = frustum->_farPlane;
  fVar2 = frustum->_left;
  fVar16 = frustum->_right;
  (this->currFrustum)._nearPlane = frustum->_nearPlane;
  (this->currFrustum)._farPlane = fVar1;
  (this->currFrustum)._left = fVar2;
  (this->currFrustum)._right = fVar16;
  fVar1 = frustum->_bottom;
  (this->currFrustum)._top = frustum->_top;
  (this->currFrustum)._bottom = fVar1;
  (this->currFrustum)._orthographic = frustum->_orthographic;
  (this->cameraMatrix).x[0][0] = cameraMat->x[0][0];
  (this->cameraMatrix).x[0][1] = cameraMat->x[0][1];
  (this->cameraMatrix).x[0][2] = cameraMat->x[0][2];
  (this->cameraMatrix).x[0][3] = cameraMat->x[0][3];
  (this->cameraMatrix).x[1][0] = cameraMat->x[1][0];
  (this->cameraMatrix).x[1][1] = cameraMat->x[1][1];
  (this->cameraMatrix).x[1][2] = cameraMat->x[1][2];
  (this->cameraMatrix).x[1][3] = cameraMat->x[1][3];
  (this->cameraMatrix).x[2][0] = cameraMat->x[2][0];
  (this->cameraMatrix).x[2][1] = cameraMat->x[2][1];
  (this->cameraMatrix).x[2][2] = cameraMat->x[2][2];
  (this->cameraMatrix).x[2][3] = cameraMat->x[2][3];
  (this->cameraMatrix).x[3][0] = cameraMat->x[3][0];
  (this->cameraMatrix).x[3][1] = cameraMat->x[3][1];
  (this->cameraMatrix).x[3][2] = cameraMat->x[3][2];
  (this->cameraMatrix).x[3][3] = cameraMat->x[3][3];
  return;
}

Assistant:

void FrustumTest<T>::setFrustum(const Frustum<T> &frustum,
                                const Matrix44<T> &cameraMat)
{
    Plane3<T> frustumPlanes[6];
    frustum.planes(frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i]     = Vec3<T>(frustumPlanes[index + 0].normal.x,
                                    frustumPlanes[index + 1].normal.x, 
                                    frustumPlanes[index + 2].normal.x);
        planeNormY[i]     = Vec3<T>(frustumPlanes[index + 0].normal.y,
                                    frustumPlanes[index + 1].normal.y,
                                    frustumPlanes[index + 2].normal.y);
        planeNormZ[i]     = Vec3<T>(frustumPlanes[index + 0].normal.z,
                                    frustumPlanes[index + 1].normal.z,
                                    frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].x),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].y), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormX[i].z));
        planeNormAbsY[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormY[i].z));
        planeNormAbsZ[i]  = Vec3<T>(IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].x), 
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].y),
                                    IMATH_INTERNAL_NAMESPACE::abs(planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T>(frustumPlanes[index + 0].distance,
                                    frustumPlanes[index + 1].distance,
                                    frustumPlanes[index + 2].distance);
    }
    currFrustum = frustum;
    cameraMatrix = cameraMat;
}